

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  long lVar3;
  xpath_node *pxVar4;
  __off_t extraout_RDX;
  __off_t _Var5;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  xpath_node *it;
  xpath_node *pxVar6;
  size_t sVar7;
  ulong uVar8;
  xpath_node *pxVar9;
  double dVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  xpath_context c;
  undefined1 extraout_var [56];
  
  auVar12 = in_ZMM1._0_16_;
  pxVar4 = ns->_end;
  pxVar9 = ns->_begin;
  uVar8 = (long)pxVar4 - (long)pxVar9 >> 4;
  if (uVar8 != first) {
    if ((this->_type & 0xfeU) != 0x10) {
      __assert_fail("_type == ast_filter || _type == ast_predicate",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x262e,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                   );
    }
    this_00 = this->_right;
    if ((this->_test & 0xfeU) == 2) {
      if (uVar8 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2610,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      if (this_00->_rettype != '\x02') {
        __assert_fail("expr->rettype() == xpath_type_number",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2611,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      pxVar9 = pxVar9 + first;
      c.n._node._root = (xml_node_struct *)0x0;
      c.n._attribute._attr = (xml_attribute_struct *)0x0;
      c.position = 1;
      c.size = uVar8 - first;
      auVar11._0_8_ = eval_number(this_00,&c,stack);
      auVar11._8_56_ = extraout_var;
      _Var5 = extraout_RDX;
      if ((1.0 <= auVar11._0_8_) &&
         (auVar12 = vcvtusi2sd_avx512f(auVar12,uVar8 - first), auVar11._0_8_ <= auVar12._0_8_)) {
        lVar3 = vcvttsd2usi_avx512f(auVar11._0_16_);
        auVar12 = vcvtusi2sd_avx512f(in_XMM2,lVar3);
        if ((auVar11._0_8_ == auVar12._0_8_) && (!NAN(auVar11._0_8_) && !NAN(auVar12._0_8_))) {
          pxVar1 = pxVar9[lVar3 + -1]._attribute._attr;
          (pxVar9->_node)._root = pxVar9[lVar3 + -1]._node._root;
          (pxVar9->_attribute)._attr = pxVar1;
          pxVar9 = pxVar9 + 1;
        }
      }
    }
    else if (this_00->_rettype == '\x02') {
      if (uVar8 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x25f6,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      _Var5 = first * 0x10;
      sVar7 = 1;
      pxVar6 = pxVar9 + first;
      pxVar9 = pxVar6;
      for (; pxVar6 != pxVar4; pxVar6 = pxVar6 + 1) {
        c.n._node._root = (pxVar6->_node)._root;
        c.n._attribute._attr = (pxVar6->_attribute)._attr;
        c.position = sVar7;
        c.size = uVar8 - first;
        dVar10 = eval_number(this_00,&c,stack);
        auVar12 = vcvtusi2sd_avx512f(in_XMM2,sVar7);
        _Var5 = extraout_RDX_00;
        if ((dVar10 == auVar12._0_8_) && (!NAN(dVar10) && !NAN(auVar12._0_8_))) {
          pxVar1 = (pxVar6->_attribute)._attr;
          (pxVar9->_node)._root = (pxVar6->_node)._root;
          (pxVar9->_attribute)._attr = pxVar1;
          pxVar9 = pxVar9 + 1;
          if (once) break;
        }
        pxVar4 = ns->_end;
        sVar7 = sVar7 + 1;
      }
    }
    else {
      if (uVar8 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x25dc,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      _Var5 = first * 0x10;
      sVar7 = 1;
      pxVar6 = pxVar9 + first;
      pxVar9 = pxVar6;
      for (; pxVar6 != pxVar4; pxVar6 = pxVar6 + 1) {
        c.n._node._root = (pxVar6->_node)._root;
        c.n._attribute._attr = (pxVar6->_attribute)._attr;
        c.position = sVar7;
        c.size = uVar8 - first;
        bVar2 = eval_boolean(this_00,&c,stack);
        _Var5 = extraout_RDX_01;
        if (bVar2) {
          pxVar1 = (pxVar6->_attribute)._attr;
          (pxVar9->_node)._root = (pxVar6->_node)._root;
          (pxVar9->_attribute)._attr = pxVar1;
          pxVar9 = pxVar9 + 1;
          if (once) break;
        }
        pxVar4 = ns->_end;
        sVar7 = sVar7 + 1;
      }
    }
    xpath_node_set_raw::truncate(ns,(char *)pxVar9,_Var5);
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}